

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::TestInfo::TestInfo
          (TestInfo *this,char *a_test_case_name,char *a_name,char *a_type_param,char *a_value_param
          ,TypeId fixture_class_id,TestFactoryBase *factory)

{
  TypeId __s;
  char *pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  bool local_6b;
  allocator<char> local_6a;
  undefined1 local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_68;
  byte local_5b;
  allocator<char> local_5a;
  undefined1 local_59;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  allocator<char> local_4d [20];
  allocator<char> local_39;
  TypeId local_38;
  TypeId fixture_class_id_local;
  char *a_value_param_local;
  char *a_type_param_local;
  char *a_name_local;
  char *a_test_case_name_local;
  TestInfo *this_local;
  
  local_38 = fixture_class_id;
  fixture_class_id_local = a_value_param;
  a_value_param_local = a_type_param;
  a_type_param_local = a_name;
  a_name_local = a_test_case_name;
  a_test_case_name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)this,a_test_case_name,&local_39);
  std::allocator<char>::~allocator(&local_39);
  pcVar1 = a_type_param_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->name_,pcVar1,local_4d);
  std::allocator<char>::~allocator(local_4d);
  local_59 = 0;
  local_5b = 0;
  if (a_value_param_local == (char *)0x0) {
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    pcVar1 = a_value_param_local;
    local_59 = 1;
    local_58 = local_d0;
    std::allocator<char>::allocator();
    local_5b = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_d0,pcVar1,&local_5a);
  }
  local_59 = 0;
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr(&this->type_param_,local_d0);
  if ((local_5b & 1) != 0) {
    std::allocator<char>::~allocator(&local_5a);
  }
  local_69 = 0;
  local_6b = fixture_class_id_local == (TypeId)0x0;
  if (local_6b) {
    local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    local_f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               operator_new(0x20);
    __s = fixture_class_id_local;
    local_69 = 1;
    local_68 = local_f8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_f8,(char *)__s,&local_6a);
  }
  local_69 = 0;
  local_6b = !local_6b;
  internal::
  scoped_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::scoped_ptr(&this->value_param_,local_f8);
  if (local_6b) {
    std::allocator<char>::~allocator(&local_6a);
  }
  this->fixture_class_id_ = local_38;
  this->should_run_ = false;
  this->is_disabled_ = false;
  this->matches_filter_ = false;
  this->factory_ = factory;
  TestResult::TestResult(&this->result_);
  return;
}

Assistant:

TestInfo::TestInfo(const char* a_test_case_name,
                   const char* a_name,
                   const char* a_type_param,
                   const char* a_value_param,
                   internal::TypeId fixture_class_id,
                   internal::TestFactoryBase* factory)
    : test_case_name_(a_test_case_name),
      name_(a_name),
      type_param_(a_type_param ? new std::string(a_type_param) : NULL),
      value_param_(a_value_param ? new std::string(a_value_param) : NULL),
      fixture_class_id_(fixture_class_id),
      should_run_(false),
      is_disabled_(false),
      matches_filter_(false),
      factory_(factory),
      result_() {}